

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O2

void boost::xpressive::detail::
     merge_charset<char,boost::xpressive::regex_traits<char,boost::xpressive::cpp_regex_traits<char>>>
               (basic_chset<char> *basic,
               compound_charset<boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>_>
               *compound,regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_> *tr)

{
  ushort uVar1;
  pointer puVar2;
  pointer puVar3;
  int i;
  long lVar4;
  ulong uVar5;
  int i_1;
  
  uVar1 = compound->posix_yes_;
  if (uVar1 != 0) {
    for (lVar4 = 0; lVar4 != 0x100; lVar4 = lVar4 + 1) {
      if (((tr->super_cpp_regex_traits<char>).super_cpp_regex_traits_base<char,_1UL>.masks_[lVar4] &
          uVar1) != 0) {
        basic_chset_8bit<char>::set(&basic->super_basic_chset_8bit<char>,(char)lVar4);
      }
    }
  }
  puVar2 = (compound->posix_no_).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar3 = (compound->posix_no_).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (puVar2 != puVar3) {
    for (uVar5 = 0; uVar5 < (ulong)((long)puVar3 - (long)puVar2 >> 1); uVar5 = uVar5 + 1) {
      uVar1 = puVar2[uVar5];
      for (lVar4 = 0; lVar4 != 0x100; lVar4 = lVar4 + 1) {
        if (((tr->super_cpp_regex_traits<char>).super_cpp_regex_traits_base<char,_1UL>.masks_[lVar4]
            & uVar1) == 0) {
          basic_chset_8bit<char>::set(&basic->super_basic_chset_8bit<char>,(char)lVar4);
        }
      }
      puVar2 = (compound->posix_no_).
               super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
               super__Vector_impl_data._M_start;
      puVar3 = (compound->posix_no_).
               super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
               super__Vector_impl_data._M_finish;
    }
  }
  if (compound->complement_ == true) {
    std::_Base_bitset<4UL>::_M_do_flip((_Base_bitset<4UL> *)basic);
    return;
  }
  return;
}

Assistant:

inline void merge_charset
(
    basic_chset<Char> &basic
  , compound_charset<Traits> const &compound
  , Traits const &tr
)
{
    detail::ignore_unused(tr);
    if(0 != compound.posix_yes())
    {
        typename Traits::char_class_type mask = compound.posix_yes();
        for(int i = 0; i <= static_cast<int>(UCHAR_MAX); ++i)
        {
            if(tr.isctype((Char)i, mask))
            {
                basic.set((Char)i);
            }
        }
    }

    if(!compound.posix_no().empty())
    {
        for(std::size_t j = 0; j < compound.posix_no().size(); ++j)
        {
            typename Traits::char_class_type mask = compound.posix_no()[j];
            for(int i = 0; i <= static_cast<int>(UCHAR_MAX); ++i)
            {
                if(!tr.isctype((Char)i, mask))
                {
                    basic.set((Char)i);
                }
            }
        }
    }

    if(compound.is_inverted())
    {
        basic.inverse();
    }
}